

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knownhost.c
# Opt level: O3

int libssh2_knownhost_writefile(LIBSSH2_KNOWNHOSTS *hosts,char *filename,int type)

{
  size_t sVar1;
  int iVar2;
  FILE *__s;
  known_host *node;
  size_t sVar3;
  char *errmsg;
  LIBSSH2_SESSION *session;
  size_t wrote;
  char buffer [4092];
  size_t local_1040;
  char local_1038 [4104];
  
  if (type == 1) {
    __s = fopen(filename,"w");
    if (__s != (FILE *)0x0) {
      node = (known_host *)_libssh2_list_first(&hosts->head);
      iVar2 = 0;
      if (node != (known_host *)0x0) {
        do {
          local_1040 = 0;
          iVar2 = knownhost_writeline(hosts,node,local_1038,0xffc,&local_1040,1);
          sVar1 = local_1040;
          if (iVar2 != 0) goto LAB_0011a025;
          sVar3 = fwrite(local_1038,1,local_1040,__s);
          if (sVar3 != sVar1) {
            iVar2 = _libssh2_error(hosts->session,-0x10,"Write failed");
            goto LAB_0011a025;
          }
          node = (known_host *)_libssh2_list_next(&node->node);
        } while (node != (known_host *)0x0);
        iVar2 = 0;
      }
LAB_0011a025:
      fclose(__s);
      return iVar2;
    }
    session = hosts->session;
    errmsg = "Failed to open file";
    iVar2 = -0x10;
  }
  else {
    session = hosts->session;
    errmsg = "Unsupported type of known-host information store";
    iVar2 = -0x21;
  }
  iVar2 = _libssh2_error(session,iVar2,errmsg);
  return iVar2;
}

Assistant:

LIBSSH2_API int
libssh2_knownhost_writefile(LIBSSH2_KNOWNHOSTS *hosts,
                            const char *filename, int type)
{
    struct known_host *node;
    FILE *file;
    int rc = LIBSSH2_ERROR_NONE;
    char buffer[4092];

    /* we only support this single file type for now, bail out on all other
       attempts */
    if(type != LIBSSH2_KNOWNHOST_FILE_OPENSSH)
        return _libssh2_error(hosts->session,
                              LIBSSH2_ERROR_METHOD_NOT_SUPPORTED,
                              "Unsupported type of known-host information "
                              "store");

    file = fopen(filename, FOPEN_WRITETEXT);
    if(!file)
        return _libssh2_error(hosts->session, LIBSSH2_ERROR_FILE,
                              "Failed to open file");

    for(node = _libssh2_list_first(&hosts->head);
        node;
        node = _libssh2_list_next(&node->node)) {
        size_t wrote = 0;
        size_t nwrote;
        rc = knownhost_writeline(hosts, node, buffer, sizeof(buffer), &wrote,
                                 type);
        if(rc)
            break;

        nwrote = fwrite(buffer, 1, wrote, file);
        if(nwrote != wrote) {
            /* failed to write the whole thing, bail out */
            rc = _libssh2_error(hosts->session, LIBSSH2_ERROR_FILE,
                                "Write failed");
            break;
        }
    }
    fclose(file);

    return rc;
}